

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O1

void __thiscall
Assimp::Q3BSPFileImporter::InternReadFile
          (Q3BSPFileImporter *this,string *rFile,aiScene *scene,IOSystem *ioHandler)

{
  bool bVar1;
  Q3BSPModel *pModel;
  runtime_error *this_00;
  long *plVar2;
  _Base_ptr p_Var3;
  Q3BSPFileImporter *this_01;
  string archiveName;
  string mapName;
  Q3BSPFileParser fileParser;
  ZipArchiveIOSystem Archive;
  string local_c8;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined1 local_88 [24];
  pointer pcStack_70;
  ZipArchiveIOSystem local_58;
  
  ZipArchiveIOSystem::ZipArchiveIOSystem(&local_58,ioHandler,rFile,"r");
  bVar1 = ZipArchiveIOSystem::isOpen(&local_58);
  if (!bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_c8,"Failed to open file ",rFile);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_c8);
    local_88._0_8_ = *plVar2;
    p_Var3 = (_Base_ptr)(plVar2 + 2);
    if ((_Base_ptr)local_88._0_8_ == p_Var3) {
      local_88._16_8_ = *(undefined8 *)p_Var3;
      pcStack_70 = (pointer)plVar2[3];
      local_88._0_8_ = (_Base_ptr)(local_88 + 0x10);
    }
    else {
      local_88._16_8_ = *(undefined8 *)p_Var3;
    }
    local_88._8_8_ = plVar2[1];
    *plVar2 = (long)p_Var3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::runtime_error::runtime_error(this_00,(string *)local_88);
    *(undefined ***)this_00 = &PTR__runtime_error_008e3168;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
  this_01 = (Q3BSPFileImporter *)local_a8;
  local_a8._0_8_ = local_a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)this_01,"");
  separateMapName(this_01,rFile,&local_c8,(string *)local_a8);
  if (local_a8._8_8_ == 0) {
    bVar1 = findFirstMapInArchive(this_01,&local_58,(string *)local_a8);
    if (!bVar1) goto LAB_005de273;
  }
  Q3BSPFileParser::Q3BSPFileParser((Q3BSPFileParser *)local_88,(string *)local_a8,&local_58);
  pModel = Q3BSPFileParser::getModel((Q3BSPFileParser *)local_88);
  if (pModel != (Q3BSPModel *)0x0) {
    CreateDataFromImport(this,pModel,scene,&local_58);
  }
  Q3BSPFileParser::~Q3BSPFileParser((Q3BSPFileParser *)local_88);
LAB_005de273:
  if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
    operator_delete((void *)local_a8._0_8_,local_98._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  ZipArchiveIOSystem::~ZipArchiveIOSystem(&local_58);
  return;
}

Assistant:

void Q3BSPFileImporter::InternReadFile(const std::string &rFile, aiScene* scene, IOSystem* ioHandler) {
    ZipArchiveIOSystem Archive( ioHandler, rFile );
    if ( !Archive.isOpen() ) {
        throw DeadlyImportError( "Failed to open file " + rFile + "." );
    }

    std::string archiveName( "" ), mapName( "" );
    separateMapName( rFile, archiveName, mapName );

    if ( mapName.empty() ) {
        if ( !findFirstMapInArchive( Archive, mapName ) ) {
            return;
        }
    }

    Q3BSPFileParser fileParser( mapName, &Archive );
    Q3BSPModel *pBSPModel = fileParser.getModel();
    if ( nullptr != pBSPModel ) {
        CreateDataFromImport( pBSPModel, scene, &Archive );
    }
}